

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathLocalNameFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlElementType xVar1;
  xmlNodeSetPtr pxVar2;
  xmlNodePtr pxVar3;
  xmlXPathObjectPtr pxVar4;
  xmlXPathObjectPtr value;
  int code;
  _xmlNode *val;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs == 0) {
    pxVar4 = xmlXPathCacheNewNodeSet(ctxt,ctxt->context->node);
    xmlXPathValuePush(ctxt,pxVar4);
    nargs = 1;
  }
  if (nargs != 1) {
    code = 0xc;
LAB_001c1a1b:
    xmlXPathErr(ctxt,code);
    return;
  }
  if (ctxt->valueNr < 1) {
    code = 0x17;
    goto LAB_001c1a1b;
  }
  if ((ctxt->value == (xmlXPathObjectPtr)0x0) ||
     ((ctxt->value->type | XPATH_USERS) != XPATH_XSLT_TREE)) {
    code = 0xb;
    goto LAB_001c1a1b;
  }
  pxVar4 = xmlXPathValuePop(ctxt);
  pxVar2 = pxVar4->nodesetval;
  if ((pxVar2 != (xmlNodeSetPtr)0x0) && (pxVar2->nodeNr != 0)) {
    pxVar3 = *pxVar2->nodeTab;
    xVar1 = pxVar3->type;
    if (1 < xVar1 - XML_ELEMENT_NODE) {
      if (xVar1 == XML_NAMESPACE_DECL) {
        val = pxVar3->children;
        goto LAB_001c19d1;
      }
      if (xVar1 != XML_PI_NODE) goto LAB_001c19ca;
    }
    val = (_xmlNode *)pxVar3->name;
    if (*(xmlChar *)&val->_private != ' ') goto LAB_001c19d1;
  }
LAB_001c19ca:
  val = (_xmlNode *)0x1e121f;
LAB_001c19d1:
  value = xmlXPathCacheNewString(ctxt,(xmlChar *)val);
  xmlXPathValuePush(ctxt,value);
  xmlXPathReleaseObject(ctxt->context,pxVar4);
  return;
}

Assistant:

void
xmlXPathLocalNameFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr cur;

    if (ctxt == NULL) return;

    if (nargs == 0) {
	xmlXPathValuePush(ctxt, xmlXPathCacheNewNodeSet(ctxt, ctxt->context->node));
	nargs = 1;
    }

    CHECK_ARITY(1);
    if ((ctxt->value == NULL) ||
	((ctxt->value->type != XPATH_NODESET) &&
	 (ctxt->value->type != XPATH_XSLT_TREE)))
	XP_ERROR(XPATH_INVALID_TYPE);
    cur = xmlXPathValuePop(ctxt);

    if ((cur->nodesetval == NULL) || (cur->nodesetval->nodeNr == 0)) {
	xmlXPathValuePush(ctxt, xmlXPathCacheNewCString(ctxt, ""));
    } else {
	int i = 0; /* Should be first in document order !!!!! */
	switch (cur->nodesetval->nodeTab[i]->type) {
	case XML_ELEMENT_NODE:
	case XML_ATTRIBUTE_NODE:
	case XML_PI_NODE:
	    if (cur->nodesetval->nodeTab[i]->name[0] == ' ')
		xmlXPathValuePush(ctxt, xmlXPathCacheNewCString(ctxt, ""));
	    else
		xmlXPathValuePush(ctxt, xmlXPathCacheNewString(ctxt,
			cur->nodesetval->nodeTab[i]->name));
	    break;
	case XML_NAMESPACE_DECL:
	    xmlXPathValuePush(ctxt, xmlXPathCacheNewString(ctxt,
			((xmlNsPtr)cur->nodesetval->nodeTab[i])->prefix));
	    break;
	default:
	    xmlXPathValuePush(ctxt, xmlXPathCacheNewCString(ctxt, ""));
	}
    }
    xmlXPathReleaseObject(ctxt->context, cur);
}